

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::Repeat(Regexp *sub,ParseFlags flags,int min,int max)

{
  Regexp *this;
  Regexp **ppRVar1;
  Regexp *re;
  int max_local;
  int min_local;
  ParseFlags flags_local;
  Regexp *sub_local;
  
  this = (Regexp *)operator_new(0x28);
  Regexp(this,kRegexpRepeat,flags);
  AllocSub(this,1);
  ppRVar1 = Regexp::sub(this);
  *ppRVar1 = sub;
  (this->field_7).field_0.min_ = min;
  (this->field_7).field_0.max_ = max;
  return this;
}

Assistant:

Regexp* Regexp::Repeat(Regexp* sub, ParseFlags flags, int min, int max) {
  Regexp* re = new Regexp(kRegexpRepeat, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  re->min_ = min;
  re->max_ = max;
  return re;
}